

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O2

void __thiscall
Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode::SectionNode
          (SectionNode *this,SectionStats *_stats)

{
  this->_vptr_SectionNode = (_func_int **)&PTR__SectionNode_001a4348;
  SectionStats::SectionStats(&this->stats,_stats);
  (this->assertions).
  super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->assertions).
  super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->childSections).
  super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->assertions).
  super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->childSections).
  super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->childSections).
  super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stdOut)._M_dataplus._M_p = (pointer)&(this->stdOut).field_2;
  (this->stdOut)._M_string_length = 0;
  (this->stdOut).field_2._M_local_buf[0] = '\0';
  (this->stdErr)._M_dataplus._M_p = (pointer)&(this->stdErr).field_2;
  (this->stdErr)._M_string_length = 0;
  (this->stdErr).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit SectionNode(SectionStats const& _stats) : stats(_stats) {}